

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

aiBone * __thiscall
Assimp::Ogre::Bone::ConvertToAssimpBone
          (Bone *this,Skeleton *param_1,
          vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *boneWeights)

{
  pointer __src;
  pointer paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  aiBone *this_00;
  aiVertexWeight *__s;
  ulong uVar17;
  
  this_00 = (aiBone *)operator_new(0x450);
  aiBone::aiBone(this_00);
  uVar17 = (this->name)._M_string_length;
  if (uVar17 < 0x400) {
    (this_00->mName).length = (ai_uint32)uVar17;
    memcpy((this_00->mName).data,(this->name)._M_dataplus._M_p,uVar17);
    (this_00->mName).data[uVar17] = '\0';
  }
  fVar13 = (this->worldMatrix).a1;
  fVar14 = (this->worldMatrix).a2;
  fVar15 = (this->worldMatrix).a3;
  fVar16 = (this->worldMatrix).a4;
  fVar9 = (this->worldMatrix).b1;
  fVar10 = (this->worldMatrix).b2;
  fVar11 = (this->worldMatrix).b3;
  fVar12 = (this->worldMatrix).b4;
  fVar5 = (this->worldMatrix).c1;
  fVar6 = (this->worldMatrix).c2;
  fVar7 = (this->worldMatrix).c3;
  fVar8 = (this->worldMatrix).c4;
  fVar2 = (this->worldMatrix).d2;
  fVar3 = (this->worldMatrix).d3;
  fVar4 = (this->worldMatrix).d4;
  (this_00->mOffsetMatrix).d1 = (this->worldMatrix).d1;
  (this_00->mOffsetMatrix).d2 = fVar2;
  (this_00->mOffsetMatrix).d3 = fVar3;
  (this_00->mOffsetMatrix).d4 = fVar4;
  (this_00->mOffsetMatrix).c1 = fVar5;
  (this_00->mOffsetMatrix).c2 = fVar6;
  (this_00->mOffsetMatrix).c3 = fVar7;
  (this_00->mOffsetMatrix).c4 = fVar8;
  (this_00->mOffsetMatrix).b1 = fVar9;
  (this_00->mOffsetMatrix).b2 = fVar10;
  (this_00->mOffsetMatrix).b3 = fVar11;
  (this_00->mOffsetMatrix).b4 = fVar12;
  (this_00->mOffsetMatrix).a1 = fVar13;
  (this_00->mOffsetMatrix).a2 = fVar14;
  (this_00->mOffsetMatrix).a3 = fVar15;
  (this_00->mOffsetMatrix).a4 = fVar16;
  __src = (boneWeights->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl
          .super__Vector_impl_data._M_start;
  paVar1 = (boneWeights->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__src != paVar1) {
    uVar17 = (long)paVar1 - (long)__src;
    this_00->mNumWeights = (uint)((long)uVar17 >> 3);
    __s = (aiVertexWeight *)
          operator_new__(-(ulong)((ulong)((long)uVar17 >> 3) >> 0x3d != 0) | uVar17);
    memset(__s,0,(uVar17 - 8 & 0xfffffffffffffff8) + 8);
    this_00->mWeights = __s;
    memcpy(__s,__src,uVar17);
  }
  return this_00;
}

Assistant:

aiBone *Bone::ConvertToAssimpBone(Skeleton * /*parent*/, const std::vector<aiVertexWeight> &boneWeights)
{
    aiBone *bone = new aiBone();
    bone->mName = name;
    bone->mOffsetMatrix = worldMatrix;

    if (!boneWeights.empty())
    {
        bone->mNumWeights = static_cast<unsigned int>(boneWeights.size());
        bone->mWeights = new aiVertexWeight[boneWeights.size()];
        memcpy(bone->mWeights, &boneWeights[0], boneWeights.size() * sizeof(aiVertexWeight));
    }

    return bone;
}